

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::drawArraysIndirect(ReferenceContext *this,deUint32 mode,void *indirect)

{
  DataBuffer *pDVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  void *pvVar5;
  pointer puVar6;
  uint *puVar7;
  
  bVar4 = predrawErrorChecks(this,mode);
  if (bVar4) {
    pDVar1 = this->m_drawIndirectBufferBinding;
    if ((pDVar1 != (DataBuffer *)0x0) && (((ulong)indirect & 3) == 0)) {
      puVar2 = (pDVar1->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar3 = (pDVar1->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pvVar5 = (void *)(long)((int)puVar3 - (int)puVar2);
      if ((indirect <= pvVar5) && ((void *)((long)indirect + 0x10U) <= pvVar5)) {
        puVar6 = (pointer)0x0;
        if (puVar2 != puVar3) {
          puVar6 = puVar2;
        }
        if (*(int *)(puVar6 + 0xc + (long)indirect) == 0) {
          puVar7 = (uint *)(puVar6 + (long)indirect);
          (*(this->super_Context)._vptr_Context[0x69])
                    (this,mode,(ulong)puVar7[2],(ulong)*puVar7,(ulong)puVar7[1]);
          return;
        }
      }
    }
    if (this->m_lastError == 0) {
      this->m_lastError = 0x502;
    }
  }
  return;
}

Assistant:

void ReferenceContext::drawArraysIndirect (deUint32 mode, const void *indirect)
{
	struct DrawArraysIndirectCommand
	{
		deUint32 count;
		deUint32 primCount;
		deUint32 first;
		deUint32 reservedMustBeZero;
	};

	const DrawArraysIndirectCommand* command;

	// Check errors

	if (!predrawErrorChecks(mode))
		return;

	// Check pointer validity

	RC_IF_ERROR(m_drawIndirectBufferBinding == DE_NULL, GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR(!deIsAlignedPtr(indirect, 4), GL_INVALID_OPERATION, RC_RET_VOID);

	// \note watch for overflows, indirect might be close to 0xFFFFFFFF and indirect+something might overflow
	RC_IF_ERROR((size_t)((const char*)indirect - (const char*)DE_NULL)                                     > (size_t)m_drawIndirectBufferBinding->getSize(), GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR((size_t)((const char*)indirect - (const char*)DE_NULL) + sizeof(DrawArraysIndirectCommand) > (size_t)m_drawIndirectBufferBinding->getSize(), GL_INVALID_OPERATION, RC_RET_VOID);

	// Check values

	command = (const DrawArraysIndirectCommand*)(m_drawIndirectBufferBinding->getData() + ((const char*)indirect - (const char*)DE_NULL));
	RC_IF_ERROR(command->reservedMustBeZero != 0, GL_INVALID_OPERATION, RC_RET_VOID);

	// draw
	drawArraysInstanced(mode, command->first, command->count, command->primCount);
}